

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_subsample_lbd_444_32x16_ssse3(uint8_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  ulong uVar21;
  __m128i *pred_buf_m128i;
  undefined1 (*pauVar22) [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pauVar22 = (undefined1 (*) [16])(cfl_type + 0x10);
  uVar21 = 0xffffffffffffffc0;
  do {
    auVar26 = pauVar22[-1];
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar26._0_13_;
    auVar1[0xe] = auVar26[7];
    auVar3[0xc] = auVar26[6];
    auVar3._0_12_ = auVar26._0_12_;
    auVar3._13_2_ = auVar1._13_2_;
    auVar5[0xb] = 0;
    auVar5._0_11_ = auVar26._0_11_;
    auVar5._12_3_ = auVar3._12_3_;
    auVar7[10] = auVar26[5];
    auVar7._0_10_ = auVar26._0_10_;
    auVar7._11_4_ = auVar5._11_4_;
    auVar9[9] = 0;
    auVar9._0_9_ = auVar26._0_9_;
    auVar9._10_5_ = auVar7._10_5_;
    auVar11[8] = auVar26[4];
    auVar11._0_8_ = auVar26._0_8_;
    auVar11._9_6_ = auVar9._9_6_;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = auVar11._8_7_;
    auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
    auVar17[0] = auVar26[3];
    auVar17._9_6_ = 0;
    auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
    auVar18[0] = auVar26[2];
    auVar18._11_4_ = 0;
    auVar13[2] = auVar26[1];
    auVar13._0_2_ = auVar26._0_2_;
    auVar13._3_12_ = SUB1512(auVar18 << 0x20,3);
    auVar25._0_2_ = auVar26._0_2_ & 0xff;
    auVar25._2_13_ = auVar13._2_13_;
    auVar25[0xf] = 0;
    auVar23[1] = 0;
    auVar23[0] = auVar26[8];
    auVar23[2] = auVar26[9];
    auVar23[3] = 0;
    auVar23[4] = auVar26[10];
    auVar23[5] = 0;
    auVar23[6] = auVar26[0xb];
    auVar23[7] = 0;
    auVar23[8] = auVar26[0xc];
    auVar23[9] = 0;
    auVar23[10] = auVar26[0xd];
    auVar23[0xb] = 0;
    auVar23[0xc] = auVar26[0xe];
    auVar23[0xd] = 0;
    auVar23[0xe] = auVar26[0xf];
    auVar23[0xf] = 0;
    auVar26 = psllw(auVar25,3);
    *(undefined1 (*) [16])((long)output_q3 + uVar21 + 0x40) = auVar26;
    auVar26 = psllw(auVar23,3);
    *(undefined1 (*) [16])((long)output_q3 + uVar21 + 0x50) = auVar26;
    auVar26 = *pauVar22;
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar26._0_13_;
    auVar2[0xe] = auVar26[7];
    auVar4[0xc] = auVar26[6];
    auVar4._0_12_ = auVar26._0_12_;
    auVar4._13_2_ = auVar2._13_2_;
    auVar6[0xb] = 0;
    auVar6._0_11_ = auVar26._0_11_;
    auVar6._12_3_ = auVar4._12_3_;
    auVar8[10] = auVar26[5];
    auVar8._0_10_ = auVar26._0_10_;
    auVar8._11_4_ = auVar6._11_4_;
    auVar10[9] = 0;
    auVar10._0_9_ = auVar26._0_9_;
    auVar10._10_5_ = auVar8._10_5_;
    auVar12[8] = auVar26[4];
    auVar12._0_8_ = auVar26._0_8_;
    auVar12._9_6_ = auVar10._9_6_;
    auVar16._7_8_ = 0;
    auVar16._0_7_ = auVar12._8_7_;
    auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
    auVar19[0] = auVar26[3];
    auVar19._9_6_ = 0;
    auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
    auVar20[0] = auVar26[2];
    auVar20._11_4_ = 0;
    auVar14[2] = auVar26[1];
    auVar14._0_2_ = auVar26._0_2_;
    auVar14._3_12_ = SUB1512(auVar20 << 0x20,3);
    auVar27._0_2_ = auVar26._0_2_ & 0xff;
    auVar27._2_13_ = auVar14._2_13_;
    auVar27[0xf] = 0;
    auVar24[1] = 0;
    auVar24[0] = auVar26[8];
    auVar24[2] = auVar26[9];
    auVar24[3] = 0;
    auVar24[4] = auVar26[10];
    auVar24[5] = 0;
    auVar24[6] = auVar26[0xb];
    auVar24[7] = 0;
    auVar24[8] = auVar26[0xc];
    auVar24[9] = 0;
    auVar24[10] = auVar26[0xd];
    auVar24[0xb] = 0;
    auVar24[0xc] = auVar26[0xe];
    auVar24[0xd] = 0;
    auVar24[0xe] = auVar26[0xf];
    auVar24[0xf] = 0;
    auVar26 = psllw(auVar27,3);
    *(undefined1 (*) [16])((long)output_q3 + uVar21 + 0x60) = auVar26;
    auVar26 = psllw(auVar24,3);
    *(undefined1 (*) [16])((long)output_q3 + uVar21 + 0x70) = auVar26;
    uVar21 = uVar21 + 0x40;
    pauVar22 = (undefined1 (*) [16])(*pauVar22 + input_stride);
  } while (uVar21 < 0x3c0);
  return;
}

Assistant:

CFL_GET_SUBSAMPLE_FUNCTION(ssse3)

static inline __m128i predict_unclipped(const __m128i *input, __m128i alpha_q12,
                                        __m128i alpha_sign, __m128i dc_q0) {
  __m128i ac_q3 = _mm_loadu_si128(input);
  __m128i ac_sign = _mm_sign_epi16(alpha_sign, ac_q3);
  __m128i scaled_luma_q0 = _mm_mulhrs_epi16(_mm_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm_add_epi16(scaled_luma_q0, dc_q0);
}